

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

bool __thiscall
QLineEditPrivate::sendMouseEventToInputContext(QLineEditPrivate *this,QMouseEvent *e)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Action AVar4;
  qsizetype qVar5;
  long lVar6;
  QEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int mousePos;
  int tmp_cursor;
  QWidgetLineControl *in_stack_ffffffffffffff78;
  CursorPosition in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar7;
  QLineEditPrivate *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_58;
  bool local_39;
  QString local_38;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QWidgetLineControl::composeMode
                    ((QWidgetLineControl *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                                      )));
  if (bVar1) {
    local_20 = QSinglePointEvent::position((QSinglePointEvent *)0x5d2c3f);
    local_10 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    QPoint::x((QPoint *)0x5d2c64);
    local_58 = xToPos(in_stack_ffffffffffffff88,
                      CONCAT13(in_stack_ffffffffffffff87,
                               CONCAT12(in_stack_ffffffffffffff86,in_stack_ffffffffffffff84)),
                      in_stack_ffffffffffffff80);
    iVar2 = QWidgetLineControl::cursor(*(QWidgetLineControl **)(in_RDI + 600));
    local_58 = local_58 - iVar2;
    bVar7 = 1;
    if (-1 < local_58) {
      lVar6 = (long)local_58;
      QWidgetLineControl::preeditAreaText(in_stack_ffffffffffffff78);
      qVar5 = QString::size(&local_38);
      bVar7 = qVar5 < lVar6;
      QString::~QString((QString *)0x5d2d0d);
    }
    if ((bVar7 & 1) != 0) {
      local_58 = -1;
    }
    if (-1 < local_58) {
      TVar3 = QEvent::type(in_RSI);
      if (TVar3 == MouseButtonRelease) {
        AVar4 = QGuiApplication::inputMethod();
        QInputMethod::invokeAction(AVar4,0);
      }
      local_39 = true;
      goto LAB_005d2d56;
    }
  }
  local_39 = false;
LAB_005d2d56:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QLineEditPrivate::sendMouseEventToInputContext( QMouseEvent *e )
{
#if !defined QT_NO_IM
    if ( control->composeMode() ) {
        int tmp_cursor = xToPos(e->position().toPoint().x());
        int mousePos = tmp_cursor - control->cursor();
        if ( mousePos < 0 || mousePos > control->preeditAreaText().size() )
            mousePos = -1;

        if (mousePos >= 0) {
            if (e->type() == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, mousePos);

            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif

    return false;
}